

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall
SQInstance::SQInstance(SQInstance *this,SQSharedState *ss,SQInstance *i,SQInteger memsize)

{
  SQUnsignedInteger SVar1;
  SQObjectPtr *local_50;
  ulong local_48;
  SQUnsignedInteger n;
  SQUnsignedInteger nvalues;
  SQInteger memsize_local;
  SQInstance *i_local;
  SQSharedState *ss_local;
  SQInstance *this_local;
  
  SQDelegable::SQDelegable(&this->super_SQDelegable);
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQInstance_0015ff58;
  local_50 = this->_values;
  do {
    ::SQObjectPtr::SQObjectPtr(local_50);
    local_50 = local_50 + 1;
  } while ((SQInstance *)local_50 != this + 1);
  this->_memsize = memsize;
  this->_class = i->_class;
  SVar1 = sqvector<SQClassMember>::size(&this->_class->_defaultvalues);
  for (local_48 = 0; local_48 < SVar1; local_48 = local_48 + 1) {
    ::SQObjectPtr::SQObjectPtr(this->_values + local_48,i->_values + local_48);
  }
  Init(this,ss);
  return;
}

Assistant:

SQInstance::SQInstance(SQSharedState *ss, SQInstance *i, SQInteger memsize)
{
    _memsize = memsize;
    _class = i->_class;
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    for(SQUnsignedInteger n = 0; n < nvalues; n++) {
        new (&_values[n]) SQObjectPtr(i->_values[n]);
    }
    Init(ss);
}